

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

bool __thiscall
SearcherPrincipalVariation::IsEndOfGame
          (SearcherPrincipalVariation *this,int *score,Position *pos,Moves *myMoves)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  Moves *myMoves_local;
  Position *pos_local;
  int *score_local;
  SearcherPrincipalVariation *this_local;
  
  bVar1 = IsDrawByRepetition(this,pos,score);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    uVar2 = Position::GetPlySinceCaptureOrPawnMove(pos);
    if (uVar2 < 100) {
      bVar1 = Position::CanKingBeCapturedNow(pos);
      if (bVar1) {
        *score = 1000000;
        this_local._7_1_ = true;
      }
      else {
        bVar1 = Position::IsStalemate(pos);
        if (bVar1) {
          *score = 0;
          this_local._7_1_ = true;
        }
        else {
          bVar1 = Position::IsCheck(pos);
          if (bVar1) {
            (*(this->super_SearcherThreaded).super_SearcherReporting.super_SearcherBase.
              _vptr_SearcherBase[10])();
            (*(this->super_SearcherThreaded).super_SearcherReporting.super_SearcherBase.
              _vptr_SearcherBase[0xd])(this,myMoves,pos);
            sVar3 = Moves::Count(myMoves);
            if (sVar3 == 0) {
              *score = -1000000;
              return true;
            }
          }
          this_local._7_1_ = false;
        }
      }
    }
    else {
      *score = 0;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IsEndOfGame( int &score, Position &pos, Moves &myMoves )
    {
        if ( IsDrawByRepetition( pos, score ) )
            return true;

        if ( pos.GetPlySinceCaptureOrPawnMove() >= 100 )
        {
            score = DRAW_SCORE;
            return true;
        }

        if ( pos.CanKingBeCapturedNow() )
        {
            score = KING_VALUE;
            return true;
        }

        if ( pos.IsStalemate() )
        {
            score = DRAW_SCORE;
            return true;
        }

        if ( pos.IsCheck() )
        {
            ExtendSearchDepth();
            FilterCheckResolvingMoves( myMoves, pos );
            if ( myMoves.Count() == 0 )
            {
                // checkmate, no move possible
                score = -KING_VALUE;
                return true;
            }
        }

        return false;
    }